

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void COVER_best_init(COVER_best_t *best)

{
  pthread_mutex_t *in_RDI;
  
  if (in_RDI != (pthread_mutex_t *)0x0) {
    pthread_mutex_init(in_RDI,(pthread_mutexattr_t *)0x0);
    pthread_cond_init((pthread_cond_t *)(in_RDI + 1),(pthread_condattr_t *)0x0);
    *(undefined8 *)((long)in_RDI + 0x58) = 0;
    *(undefined8 *)((long)in_RDI + 0x60) = 0;
    *(undefined8 *)((long)in_RDI + 0x68) = 0;
    in_RDI[4].__align = -1;
    memset((void *)((long)in_RDI + 0x70),0,0x30);
  }
  return;
}

Assistant:

void COVER_best_init(COVER_best_t *best) {
  if (best==NULL) return; /* compatible with init on NULL */
  (void)ZSTD_pthread_mutex_init(&best->mutex, NULL);
  (void)ZSTD_pthread_cond_init(&best->cond, NULL);
  best->liveJobs = 0;
  best->dict = NULL;
  best->dictSize = 0;
  best->compressedSize = (size_t)-1;
  memset(&best->parameters, 0, sizeof(best->parameters));
}